

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffikfm(fitsfile *fptr,char *keyname,double *value,int decim,char *comm,int *status)

{
  size_t sVar1;
  size_t sVar2;
  char local_138 [8];
  char card [81];
  char local_d8 [8];
  char tmpstring [71];
  char local_88 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  int decim_local;
  double *value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x100001ca = status;
    strcpy(local_88,"(");
    ffd2f(*value,decim,local_d8,stack0xffffffffffffffc0);
    sVar1 = strlen(local_d8);
    if (sVar1 + 3 < 0x47) {
      strcat(local_88,local_d8);
      strcat(local_88,", ");
      ffd2f(value[1],decim,local_d8,stack0xffffffffffffffc0);
      sVar1 = strlen(local_88);
      sVar2 = strlen(local_d8);
      if (sVar1 + sVar2 + 1 < 0x47) {
        strcat(local_88,local_d8);
        strcat(local_88,")");
        ffmkky(keyname,local_88,comm,local_138,stack0xffffffffffffffc0);
        ffikey(fptr,local_138,stack0xffffffffffffffc0);
        fptr_local._4_4_ = *stack0xffffffffffffffc0;
      }
      else {
        ffpmsg("complex key value too long (ffikfm)");
        *stack0xffffffffffffffc0 = 0x192;
        fptr_local._4_4_ = 0x192;
      }
    }
    else {
      ffpmsg("complex key value too long (ffikfm)");
      *stack0xffffffffffffffc0 = 0x192;
      fptr_local._4_4_ = 0x192;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffikfm(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           double *value,           /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */ 
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);


    strcpy(valstring, "(" );
    ffd2f(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(tmpstring)+3 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffikfm)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffd2f(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring) + strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffikfm)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffikey(fptr, card, status);  /* write the keyword*/

    return(*status);
}